

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::PackSnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackSnorm4x8CaseInstance *this)

{
  ShaderExecutor *pSVar1;
  TestStatus *pTVar2;
  deUint32 dVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  int extraout_XMM0_Db;
  float fVar16;
  int extraout_XMM0_Dc;
  float fVar17;
  int extraout_XMM0_Dd;
  float fVar18;
  undefined1 auVar15 [16];
  uint uVar19;
  uint uVar23;
  uint uVar24;
  undefined1 auVar20 [16];
  uint uVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  int iVar27;
  int iVar28;
  int iVar29;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  TestLog *local_278;
  long lStack_270;
  long local_268;
  PackSnorm4x8CaseInstance *local_258;
  int local_24c;
  pointer local_248;
  int aiStack_240 [2];
  float local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  float local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  float local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  ulong local_1e8;
  TestStatus *local_1e0;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  deRandom local_1c8;
  undefined1 local_1b8 [8];
  long lStack_1b0;
  TestLog local_1a8 [13];
  ios_base local_140 [272];
  
  dVar3 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_1c8,dVar3 ^ 0x42f2c0);
  local_268 = 0;
  local_278 = (TestLog *)0x0;
  lStack_270 = 0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_24c = 1;
  if (1 < this->m_precision - PRECISION_MEDIUMP) {
    local_24c = (uint)(this->m_precision == PRECISION_LOWP) * 2;
  }
  local_1b8 = (undefined1  [8])0x0;
  lStack_1b0 = 0;
  local_258 = this;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_278,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3f800000bf800000;
  lStack_1b0 = 0x3f800000bf800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_278,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf0000003f000000;
  lStack_1b0 = 0x3f000000bf000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_278,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3fc00000bfc00000;
  lStack_1b0 = 0x3fc00000bfc00000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_278,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf4000003e800000;
  lStack_1b0 = 0x3f400000be800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_278,
             (Vector<float,_4> *)local_1b8);
  iVar6 = 0xf;
  do {
    fVar14 = deRandom_getFloat(&local_1c8);
    local_218 = fVar14 * 2.5 + -1.25;
    fVar14 = deRandom_getFloat(&local_1c8);
    local_228 = fVar14 * 2.5 + -1.25;
    local_238 = deRandom_getFloat(&local_1c8);
    fVar14 = deRandom_getFloat(&local_1c8);
    lStack_1b0 = CONCAT44(fVar14 * 2.5 + -1.25,local_238 * 2.5 + -1.25);
    local_1b8._4_4_ = local_228;
    local_1b8._0_4_ = local_218;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_278,
               (Vector<float,_4> *)local_1b8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 0x50;
  do {
    fVar14 = deRandom_getFloat(&local_1c8);
    local_218 = fVar14 * 1e+06 + -500000.0;
    fVar14 = deRandom_getFloat(&local_1c8);
    local_228 = fVar14 * 1e+06 + -500000.0;
    local_238 = deRandom_getFloat(&local_1c8);
    iStack_234 = extraout_XMM0_Db;
    iStack_230 = extraout_XMM0_Dc;
    iStack_22c = extraout_XMM0_Dd;
    fVar14 = deRandom_getFloat(&local_1c8);
    lStack_1b0 = CONCAT44(fVar14 * 1e+06 + -500000.0,local_238 * 1e+06 + -500000.0);
    local_1b8._4_4_ = local_228;
    local_1b8._0_4_ = local_218;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_278,
               (Vector<float,_4> *)local_1b8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_208,lStack_270 - (long)local_278 >> 4);
  local_1b8 = (undefined1  [8])
              ((local_258->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&lStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&lStack_1b0,"Executing shader for ",0x15);
  local_1e0 = __return_storage_ptr__;
  std::ostream::_M_insert<unsigned_long>((ulong)&lStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_1b0," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])local_278;
  local_248 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  pSVar1 = (local_258->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  iVar6 = 0;
  (*pSVar1->_vptr_ShaderExecutor[2])
            (pSVar1,(ulong)(lStack_270 - (long)local_278) >> 4,local_1b8,&local_248,0);
  local_1e8 = (ulong)(lStack_270 - (long)local_278) >> 4;
  uVar4 = (uint)local_1e8;
  if (0 < (int)uVar4) {
    lVar7 = 0;
    uVar5 = 0;
    iVar6 = 0;
    local_1d8 = local_24c;
    iStack_1d4 = local_24c;
    iStack_1d0 = local_24c;
    iStack_1cc = local_24c;
    iVar8 = local_24c;
    iVar27 = local_24c;
    iVar28 = local_24c;
    iVar29 = local_24c;
    do {
      auVar15 = *(undefined1 (*) [16])((long)&local_278->m_log + lVar7);
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar20 = minps(auVar20,auVar15);
      uVar9 = -(uint)(auVar15._0_4_ < -1.0);
      uVar10 = -(uint)(auVar15._4_4_ < -1.0);
      uVar11 = -(uint)(auVar15._8_4_ < -1.0);
      uVar12 = -(uint)(auVar15._12_4_ < -1.0);
      fVar14 = (float)(uVar9 & 0xc2fe0000 | ~uVar9 & (uint)(auVar20._0_4_ * 127.0));
      fVar16 = (float)(uVar10 & 0xc2fe0000 | ~uVar10 & (uint)(auVar20._4_4_ * 127.0));
      fVar17 = (float)(uVar11 & 0xc2fe0000 | ~uVar11 & (uint)(auVar20._8_4_ * 127.0));
      fVar18 = (float)(uVar12 & 0xc2fe0000 | ~uVar12 & (uint)(auVar20._12_4_ * 127.0));
      uVar10 = -(uint)(fVar14 < 0.0);
      uVar11 = -(uint)(fVar16 < 0.0);
      uVar12 = -(uint)(fVar17 < 0.0);
      uVar13 = -(uint)(fVar18 < 0.0);
      uVar9 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      uVar10 = (uint)((float)(uVar10 & 0xbf000000 | ~uVar10 & 0x3f000000) + fVar14);
      uVar11 = (uint)((float)(uVar11 & 0xbf000000 | ~uVar11 & 0x3f000000) + fVar16);
      uVar12 = (uint)((float)(uVar12 & 0xbf000000 | ~uVar12 & 0x3f000000) + fVar17);
      uVar13 = (uint)((float)(uVar13 & 0xbf000000 | ~uVar13 & 0x3f000000) + fVar18);
      uVar19 = -(uint)((int)uVar10 < 0x7f);
      uVar23 = -(uint)((int)uVar11 < 0x7f);
      uVar24 = -(uint)((int)uVar12 < 0x7f);
      uVar25 = -(uint)((int)uVar13 < 0x7f);
      uVar10 = ~uVar19 & 0x7f | uVar10 & uVar19;
      uVar11 = ~uVar23 & 0x7f | uVar11 & uVar23;
      uVar12 = ~uVar24 & 0x7f | uVar12 & uVar24;
      uVar13 = ~uVar25 & 0x7f | uVar13 & uVar25;
      uVar19 = -(uint)(-0x80 < (int)uVar10);
      uVar23 = -(uint)(-0x80 < (int)uVar11);
      uVar24 = -(uint)(-0x80 < (int)uVar12);
      uVar25 = -(uint)(-0x80 < (int)uVar13);
      local_228 = (float)(~uVar19 & 0xffffff80 | uVar10 & uVar19);
      uStack_224 = ~uVar23 & 0xffffff80 | uVar11 & uVar23;
      uStack_220 = ~uVar24 & 0xffffff80 | uVar12 & uVar24;
      uStack_21c = ~uVar25 & 0xffffff80 | uVar13 & uVar25;
      local_218 = (float)((uint)local_228 & 0xff);
      uStack_214 = uStack_224 & 0xff;
      uStack_210 = uStack_220 & 0xff;
      uStack_20c = uStack_21c & 0xff;
      uVar19 = (int)local_218 - (uVar9 & 0xff);
      uVar23 = uStack_214 - (uVar9 >> 8 & 0xff);
      uVar24 = uStack_210 - (uVar9 >> 0x10 & 0xff);
      uVar25 = uStack_20c - (uVar9 >> 0x18);
      uVar10 = (int)uVar19 >> 0x1f;
      uVar11 = (int)uVar23 >> 0x1f;
      uVar12 = (int)uVar24 >> 0x1f;
      uVar13 = (int)uVar25 >> 0x1f;
      local_238 = (float)((uVar19 ^ uVar10) - uVar10);
      iStack_234 = (uVar23 ^ uVar11) - uVar11;
      iStack_230 = (uVar24 ^ uVar12) - uVar12;
      iStack_22c = (uVar25 ^ uVar13) - uVar13;
      auVar15._0_4_ = -(uint)(iVar8 < (int)local_238);
      auVar15._4_4_ = -(uint)(iVar27 < iStack_234);
      auVar15._8_4_ = -(uint)(iVar28 < iStack_230);
      auVar15._12_4_ = -(uint)(iVar29 < iStack_22c);
      auVar21._4_4_ = auVar15._4_4_;
      auVar21._0_4_ = auVar15._4_4_;
      auVar21._8_4_ = auVar15._4_4_;
      auVar21._12_4_ = auVar15._4_4_;
      auVar26._4_4_ = auVar15._12_4_;
      auVar26._0_4_ = auVar15._8_4_;
      auVar26._8_4_ = auVar15._8_4_;
      auVar26._12_4_ = auVar15._12_4_;
      auVar22._4_4_ = auVar15._12_4_;
      auVar22._0_4_ = auVar15._12_4_;
      auVar22._8_4_ = auVar15._12_4_;
      auVar22._12_4_ = auVar15._12_4_;
      if (((auVar22 | auVar15 | auVar26 | auVar21) & (undefined1  [16])0x1) != (undefined1  [16])0x0
         ) {
        if (iVar6 < 10) {
          local_1b8 = (undefined1  [8])
                      ((local_258->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&lStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&lStack_1b0,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<((ostringstream *)&lStack_1b0,(int)uVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&lStack_1b0,", expected packSnorm4x8(",0x18);
          tcu::operator<<((ostream *)&lStack_1b0,
                          (Vector<float,_4> *)((long)&local_278->m_log + lVar7));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_1b0,") = ",4);
          local_248 = (pointer)(ulong)((uint)local_218 |
                                      uStack_214 << 8 | uStack_210 << 0x10 | uStack_224 << 0x18);
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_248,(ostream *)&lStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_1b0,", got ",6);
          local_248 = (pointer)(ulong)uVar9;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_248,(ostream *)&lStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&lStack_1b0,"\n  diffs = ",0xb);
          local_248 = (pointer)CONCAT44(iStack_234,local_238);
          aiStack_240[1] = iStack_22c;
          aiStack_240[0] = iStack_230;
          tcu::operator<<((ostream *)&lStack_1b0,(Vector<int,_4> *)&local_248);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&lStack_1b0,", max diff = ",0xd);
          std::ostream::operator<<((ostringstream *)&lStack_1b0,local_24c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lStack_1b0);
          std::ios_base::~ios_base(local_140);
          iVar8 = local_1d8;
          iVar27 = iStack_1d4;
          iVar28 = iStack_1d0;
          iVar29 = iStack_1cc;
        }
        else if (iVar6 == 10) {
          local_1b8 = (undefined1  [8])
                      ((local_258->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&lStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_1b0,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lStack_1b0);
          std::ios_base::~ios_base(local_140);
          iVar8 = local_1d8;
          iVar27 = iStack_1d4;
          iVar28 = iStack_1d0;
          iVar29 = iStack_1cc;
        }
        iVar6 = iVar6 + 1;
      }
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x10;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  local_1b8 = (undefined1  [8])
              ((local_258->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&lStack_1b0);
  iVar8 = (int)local_1e8;
  std::ostream::operator<<((ostringstream *)&lStack_1b0,iVar8 - iVar6);
  pTVar2 = local_1e0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_1b0," / ",3);
  std::ostream::operator<<((ostringstream *)&lStack_1b0,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&lStack_1b0," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])local_1a8;
  if (iVar6 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
    pTVar2->m_code = QP_TEST_RESULT_PASS;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_1b8,(long)(qpTestLog **)local_1b8 + lStack_1b0
              );
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Result comparison failed","");
    pTVar2->m_code = QP_TEST_RESULT_FAIL;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_1b8,(long)(qpTestLog **)local_1b8 + lStack_1b0
              );
  }
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8[0].m_log)->flags + 1));
  }
  if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278 != (TestLog *)0x0) {
    operator_delete(local_278,local_268 - (long)local_278);
  }
  return pTVar2;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		de::Random					rnd			(deStringHash(m_name) ^ 0x42f2c0);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^7) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^7) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			const float z = rnd.getFloat()*2.5f - 1.25f;
			const float w = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			const float z = rnd.getFloat()*1e6f - 0.5e6f;
			const float w = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}